

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::
Maybe<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
::Maybe(Maybe<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
        *this,Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
              *t)

{
  Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
  *t_00;
  Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
  *t_local;
  Maybe<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
  *this_local;
  
  t_00 = mv<kj::_::Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>>
                   (t);
  kj::_::
  NullableValue<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
  ::NullableValue(&this->ptr,t_00);
  return;
}

Assistant:

Maybe(T&& t): ptr(kj::mv(t)) {}